

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::all2allv<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          comm *comm)

{
  int iVar1;
  size_type sVar2;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  unsigned_long *msgs_local;
  
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(send_sizes);
  iVar1 = mxx::comm::size((comm *)recv_sizes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar2 != (long)iVar1) {
    assert_fail("send_sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x54e,"all2allv");
  }
  all2all<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,send_sizes,
             (comm *)recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  all2allv<unsigned_long>
            (__return_storage_ptr__,msgs,send_sizes,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
             (comm *)recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const mxx::comm& comm = mxx::comm()) {
    // first get recv sizes
    MXX_ASSERT(send_sizes.size() == static_cast<size_t>(comm.size()));
    std::vector<size_t> recv_sizes = all2all(send_sizes, comm);
    return all2allv(msgs, send_sizes, recv_sizes, comm);
}